

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

HandlePtr dg::vr::RelationsAnalyzer::getHandleFromFroms
                    (ValueRelations *toRels,ValueRelations *fromRels,V val)

{
  HandlePtr pBVar1;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> froms;
  vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_28;
  
  getFroms(&local_28,fromRels,val);
  pBVar1 = getHandleFromFroms(toRels,&local_28);
  if (local_28.super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pBVar1;
}

Assistant:

RelationsAnalyzer::HandlePtr
RelationsAnalyzer::getHandleFromFroms(const ValueRelations &toRels,
                                      const ValueRelations &fromRels, V val) {
    auto froms = getFroms(fromRels, val);
    auto to = getHandleFromFroms(toRels, froms);
    return to;
}